

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_map_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *funcptr;
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  ulong idx;
  vm_rcdesc rc;
  
  if (getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar6 != 0) {
      getp_map_all::desc.min_argc_ = 1;
      getp_map_all::desc.opt_argc_ = 0;
      getp_map_all::desc.varargs_ = 0;
      __cxa_guard_release(&getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  vm_rcdesc::vm_rcdesc(&rc,"Vector.mapAll",self,10,sp_ + -1,argc);
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_map_all::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    funcptr = sp_ + -1;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar5->val).obj = self;
    idx = 0;
    vVar7 = create(0,(ulong)*(ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar7 >> 0xc];
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    while (idx < *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2)) {
      push_element(this,idx);
      CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,&rc,0);
      set_element((CVmObjVector *)(pCVar1 + (vVar7 & 0xfff)),idx,&r0_);
      idx = idx + 1;
      *(short *)(*(long *)((long)&pCVar1[vVar7 & 0xfff].ptr_ + 8) + 2) = (short)idx;
    }
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_map_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    const vm_val_t *func_val;
    size_t idx;
    CVmObjVector *new_vec;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.mapAll", self, 10, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate a new vector for the return value - the new vector will
     *   have the same size as the original, since we're mapping each
     *   element of the old vector to the corresponding element of the new
     *   vector 
     */
    retval->set_obj(create(vmg_ FALSE, get_allocated_count()));

    /* get the return value as an vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our vector, and invoke the callback on
     *   each element, storing the result in the corresponding element of
     *   the new vector.  Note that we re-check the element count on each
     *   iteration, in case the callback changes it on us.  
     */
    for (idx = 0 ; idx < get_element_count() ; ++idx)
    {
        /* push the element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* 
         *   replace this element with the result (there's no need to save
         *   undo, since the whole vector is new) 
         */
        new_vec->set_element(idx, G_interpreter->get_r0());
        new_vec->set_element_count(idx + 1);
    }

    /* discard our gc protection (self, new vector) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}